

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

void LinkedReadsDatastore::build_from_fastq
               (string *output_filename,string *default_name,string *read1_filename,
               string *read2_filename,LinkedReadsFormat format,uint64_t readsize,size_t chunksize)

{
  pointer *this;
  byte bVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 uVar4;
  int *piVar5;
  char *pcVar6;
  runtime_error *prVar7;
  long lVar8;
  size_type sVar9;
  void *pvVar10;
  reference pLVar11;
  pointer puVar12;
  long lVar13;
  reference pvVar14;
  size_type sVar15;
  ulong uVar16;
  ostream *poVar17;
  LinkedReadData *pLVar18;
  undefined8 *puVar19;
  LinkedTag *pLVar20;
  streamoff *psVar21;
  bool bVar22;
  vector<LinkedReadData,_std::allocator<LinkedReadData>_> *in_stack_ffffffffffffe648;
  LinkedReadData *in_stack_ffffffffffffe650;
  LinkedReadData *this_00;
  __normal_iterator<LinkedReadData_*,_std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>_>
  in_stack_ffffffffffffe658;
  __normal_iterator<LinkedReadData_*,_std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>_>
  in_stack_ffffffffffffe660;
  size_type in_stack_ffffffffffffe668;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffe670;
  size_type in_stack_ffffffffffffe678;
  vector<LinkedReadData,_std::allocator<LinkedReadData>_> *in_stack_ffffffffffffe680;
  unsigned_long in_stack_ffffffffffffe688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe690;
  char *in_stack_ffffffffffffe698;
  pointer local_1868;
  pointer local_1850;
  pointer local_1790;
  pointer local_1778;
  string local_1518 [32];
  string local_14f8 [32];
  string local_14d8 [36];
  int local_14b4;
  reference pbStack_14b0;
  int i_4;
  basic_ifstream<char,_std::char_traits<char>_> *c;
  iterator __end1;
  iterator __begin1;
  vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  *__range1;
  undefined8 local_1488;
  vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
  reads_in_node;
  vector<long,_std::allocator<long>_> read_to_node;
  int i_3;
  LinkedTag *t;
  LinkedTag *__end2_1;
  LinkedTag *__begin2_1;
  LinkedTag (*__range2_1) [620709];
  LinkedTag mintag;
  int i_2;
  unsigned_long __vla_expr3;
  unsigned_long __vla_expr2;
  int local_1408;
  undefined2 local_1404;
  undefined1 local_1401;
  int openfiles;
  SDG_FILETYPE type;
  long local_13e0;
  ofstream output;
  string local_1178 [32];
  string local_1158 [32];
  string local_1138 [32];
  string local_1118 [32];
  string local_10f8 [32];
  string local_10d8 [32];
  string local_10b8 [32];
  reference local_1098;
  LinkedReadData *r_1;
  iterator __end2;
  iterator __begin2;
  vector<LinkedReadData,_std::allocator<LinkedReadData>_> *__range2;
  unsigned_long __vla_expr1;
  string local_1000 [32];
  string local_fe0 [32];
  string local_fc0 [32];
  string local_fa0 [32];
  string local_f80 [32];
  string local_f60 [32];
  string local_f40 [32];
  long local_f20;
  ofstream ofile_1;
  string local_ca8 [32];
  string local_c88 [32];
  string local_c68 [32];
  string local_c48 [32];
  string local_c28 [32];
  string local_c08 [32];
  string local_be8 [32];
  reference local_bc8;
  LinkedReadData *r;
  iterator __end3;
  iterator __begin3;
  vector<LinkedReadData,_std::allocator<LinkedReadData>_> *__range3;
  unsigned_long __vla_expr0;
  string local_b30 [32];
  string local_b10 [32];
  string local_af0 [32];
  string local_ad0 [32];
  string local_ab0 [32];
  string local_a90 [32];
  string local_a70 [32];
  long local_a50;
  ofstream ofile;
  string local_818 [39];
  allocator local_7f1;
  string local_7f0 [39];
  undefined1 local_7c9;
  string local_7a8 [39];
  undefined1 local_781;
  string local_760 [39];
  allocator local_739;
  string local_738 [32];
  int local_718;
  undefined1 local_711;
  int i_1;
  string local_6f0 [39];
  undefined1 local_6c9;
  string local_6a8 [39];
  allocator local_681;
  string local_680 [39];
  undefined1 local_659;
  string local_638 [39];
  undefined1 local_611;
  string local_5f0 [39];
  allocator local_5c9;
  string local_5c8 [32];
  int local_5a8;
  undefined1 local_5a1;
  int i;
  string local_580 [36];
  int local_55c;
  ulong uStack_558;
  LinkedTag newtag;
  uint64_t pairs;
  LinkedReadData currrent_read;
  vector<LinkedReadData,_std::allocator<LinkedReadData>_> next_in_chunk;
  vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  chunkfiles;
  vector<LinkedReadData,_std::allocator<LinkedReadData>_> readdatav;
  uint64_t tagged_reads;
  uint64_t r2offset;
  uint64_t r1offset;
  char readbuffer [1000];
  string local_b8 [32];
  long local_98;
  gzFile fd2;
  string local_88 [32];
  long local_68;
  gzFile fd1;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> read_tag;
  uint64_t readsize_local;
  LinkedReadsFormat format_local;
  string *read2_filename_local;
  string *read1_filename_local;
  string *default_name_local;
  string *output_filename_local;
  
  read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)readsize;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3be4ac);
  poVar3 = sdglib::OutputLog((LogLevels)(in_stack_ffffffffffffe678 >> 0x20),
                             SUB81(in_stack_ffffffffffffe678 >> 0x18,0));
  poVar3 = std::operator<<(poVar3,"Creating Datastore Index from ");
  poVar3 = std::operator<<(poVar3,(string *)read1_filename);
  poVar3 = std::operator<<(poVar3," | ");
  poVar3 = std::operator<<(poVar3,(string *)read2_filename);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  uVar4 = std::__cxx11::string::c_str();
  local_68 = gzopen(uVar4,"r");
  if (local_68 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
    poVar3 = std::operator<<(poVar3,(string *)read1_filename);
    poVar3 = std::operator<<(poVar3,": ");
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    std::operator<<(poVar3,pcVar6);
    fd2._7_1_ = 1;
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_ffffffffffffe698,in_stack_ffffffffffffe690);
    std::runtime_error::runtime_error(prVar7,local_88);
    fd2._7_1_ = 0;
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar4 = std::__cxx11::string::c_str();
  local_98 = gzopen(uVar4,"r");
  if (local_98 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
    poVar3 = std::operator<<(poVar3,(string *)read2_filename);
    poVar3 = std::operator<<(poVar3,": ");
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    std::operator<<(poVar3,pcVar6);
    readbuffer[999] = '\x01';
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_ffffffffffffe698,in_stack_ffffffffffffe690);
    std::runtime_error::runtime_error(prVar7,local_b8);
    readbuffer[999] = '\0';
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  poVar3 = sdglib::OutputLog((LogLevels)(in_stack_ffffffffffffe678 >> 0x20),
                             SUB81(in_stack_ffffffffffffe678 >> 0x18,0));
  poVar3 = std::operator<<(poVar3,"Building tag sorted chunks of ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,chunksize);
  poVar3 = std::operator<<(poVar3," pairs");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::vector
            ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)0x3be8a5);
  std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::reserve
            (in_stack_ffffffffffffe680,in_stack_ffffffffffffe678);
  std::
  vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            *)0x3be8c3);
  std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::vector
            ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)0x3be8cf);
  LinkedReadData::LinkedReadData(in_stack_ffffffffffffe650);
  uStack_558 = 0;
LAB_003be8e6:
  while( true ) {
    iVar2 = gzeof(local_68);
    bVar22 = false;
    if (iVar2 == 0) {
      iVar2 = gzeof(local_98);
      bVar22 = iVar2 == 0;
    }
    if (!bVar22) {
      sVar9 = std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::size
                        ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)
                         &chunkfiles.
                          super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar9 != 0) {
        std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::begin
                  (in_stack_ffffffffffffe648);
        std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::end(in_stack_ffffffffffffe648)
        ;
        std::
        sort<__gnu_cxx::__normal_iterator<LinkedReadData*,std::vector<LinkedReadData,std::allocator<LinkedReadData>>>>
                  (in_stack_ffffffffffffe660,in_stack_ffffffffffffe658);
        std::
        vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
        ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                *)&next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::to_string(in_stack_ffffffffffffe688);
        std::operator+((char *)in_stack_ffffffffffffe658._M_current,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe650);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe658._M_current,(char *)in_stack_ffffffffffffe650);
        std::ofstream::ofstream(&local_f20,local_f40,_S_out);
        std::__cxx11::string::~string(local_f40);
        std::__cxx11::string::~string(local_f60);
        std::__cxx11::string::~string(local_f80);
        poVar3 = sdglib::OutputLog((LogLevels)(in_stack_ffffffffffffe678 >> 0x20),
                                   SUB81(in_stack_ffffffffffffe678 >> 0x18,0));
        sVar9 = std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::size
                          ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)
                           &chunkfiles.
                            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar9);
        poVar3 = std::operator<<(poVar3," pairs dumping on chunk ");
        sVar9 = std::
                vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        *)&next_in_chunk.
                           super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar10 = (void *)std::ostream::operator<<(poVar3,sVar9);
        std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
        bVar1 = std::ios::operator!((ios *)((long)&local_f20 + *(long *)(local_f20 + -0x18)));
        if ((bVar1 & 1) != 0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
          std::
          vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  *)&next_in_chunk.
                     super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::to_string(in_stack_ffffffffffffe688);
          std::operator+((char *)in_stack_ffffffffffffe658._M_current,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe650);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe658._M_current,(char *)in_stack_ffffffffffffe650);
          poVar3 = std::operator<<(poVar3,local_fa0);
          poVar3 = std::operator<<(poVar3,": ");
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          std::operator<<(poVar3,pcVar6);
          std::__cxx11::string::~string(local_fa0);
          std::__cxx11::string::~string(local_fc0);
          std::__cxx11::string::~string(local_fe0);
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::
          vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  *)&next_in_chunk.
                     super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::to_string(in_stack_ffffffffffffe688);
          std::operator+((char *)in_stack_ffffffffffffe658._M_current,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe650);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe658._M_current,(char *)in_stack_ffffffffffffe650);
          std::operator+((char *)in_stack_ffffffffffffe658._M_current,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe650);
          std::runtime_error::runtime_error(prVar7,local_1000);
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        poVar3 = sdglib::OutputLog((LogLevels)(in_stack_ffffffffffffe678 >> 0x20),
                                   SUB81(in_stack_ffffffffffffe678 >> 0x18,0));
        sVar9 = std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::size
                          ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)
                           &chunkfiles.
                            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar9);
        poVar3 = std::operator<<(poVar3," pairs dumping on chunk ");
        sVar9 = std::
                vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        *)&next_in_chunk.
                           super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
        pvVar10 = (void *)std::ostream::operator<<(poVar3,sVar9);
        std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
        lVar8 = -((long)read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage * 2 + 0x11U &
                 0xfffffffffffffff0);
        puVar19 = (undefined8 *)(&stack0xffffffffffffe648 + lVar8);
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0a63;
        __end2 = std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::begin
                           ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)*puVar19);
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0a76;
        r_1 = (LinkedReadData *)
              std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::end
                        ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)*puVar19);
        while( true ) {
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0a90;
          bVar22 = __gnu_cxx::operator!=
                             (*(__normal_iterator<LinkedReadData_*,_std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>_>
                                **)(&stack0xffffffffffffe650 + lVar8),
                              (__normal_iterator<LinkedReadData_*,_std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>_>
                               *)*puVar19);
          if (!bVar22) break;
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0aa5;
          pLVar11 = __gnu_cxx::
                    __normal_iterator<LinkedReadData_*,_std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>_>
                    ::operator*(&__end2);
          local_1098 = pLVar11;
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0ac4;
          std::ostream::write((char *)&local_f20,(long)pLVar11);
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0adf;
          memset(puVar19,0,
                 (long)read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage * 2 + 2);
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0aef;
          pvVar10 = (void *)std::__cxx11::string::data();
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0b06;
          puVar12 = (pointer)std::__cxx11::string::size();
          if (read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage < puVar12) {
            local_1850 = read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0b29;
            local_1850 = (pointer)std::__cxx11::string::size();
          }
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0b4a;
          memcpy(puVar19,pvVar10,(size_t)local_1850);
          lVar13 = (long)puVar19 +
                   (long)read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0b70;
          pvVar10 = (void *)std::__cxx11::string::data();
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0b87;
          puVar12 = (pointer)std::__cxx11::string::size();
          if (read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage < puVar12) {
            local_1868 = read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          else {
            *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0baa;
            local_1868 = (pointer)std::__cxx11::string::size();
          }
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0bcb;
          memcpy((void *)(lVar13 + 1),pvVar10,(size_t)local_1868);
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0be7;
          std::ostream::write((char *)&local_f20,(long)puVar19);
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0bf7;
          __gnu_cxx::
          __normal_iterator<LinkedReadData_*,_std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>_>
          ::operator++(&__end2);
        }
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0c08;
        std::ofstream::close();
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0c16;
        std::
        vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
        ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                *)&next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0c25;
        std::__cxx11::to_string(*(unsigned_long *)(&stack0xffffffffffffe688 + lVar8));
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0c41;
        std::operator+(*(char **)(&stack0xffffffffffffe658 + lVar8),
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (&stack0xffffffffffffe650 + lVar8));
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0c5d;
        std::operator+(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (&stack0xffffffffffffe658 + lVar8),
                       *(char **)(&stack0xffffffffffffe650 + lVar8));
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0c72;
        std::vector<std::ifstream,std::allocator<std::ifstream>>::emplace_back<std::__cxx11::string>
                  (*(vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                     **)(&stack0xffffffffffffe660 + lVar8),
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (&stack0xffffffffffffe658 + lVar8));
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0c80;
        std::__cxx11::string::~string(local_10b8);
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0c8c;
        std::__cxx11::string::~string(local_10d8);
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0c98;
        std::__cxx11::string::~string(local_10f8);
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0ca4;
        pvVar14 = std::
                  vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  ::back(*(vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                           **)(&stack0xffffffffffffe650 + lVar8));
        lVar13 = *(long *)(*(long *)pvVar14 + -0x18);
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0cb6;
        bVar1 = std::ios::operator!((ios *)(pvVar14 + lVar13));
        if ((bVar1 & 1) != 0) {
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0ce0;
          poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0cf5;
          std::
          vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  *)&next_in_chunk.
                     super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0d04;
          std::__cxx11::to_string(*(unsigned_long *)(&stack0xffffffffffffe688 + lVar8));
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0d20;
          std::operator+(*(char **)(&stack0xffffffffffffe658 + lVar8),
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (&stack0xffffffffffffe650 + lVar8));
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0d3c;
          std::operator+(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (&stack0xffffffffffffe658 + lVar8),
                         *(char **)(&stack0xffffffffffffe650 + lVar8));
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0d51;
          poVar3 = std::operator<<(poVar3,local_1118);
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0d6d;
          poVar3 = std::operator<<(poVar3,": ");
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0d7b;
          piVar5 = __errno_location();
          iVar2 = *piVar5;
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0d82;
          pcVar6 = strerror(iVar2);
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0d91;
          std::operator<<(poVar3,pcVar6);
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0d9f;
          std::__cxx11::string::~string(local_1118);
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0dab;
          std::__cxx11::string::~string(local_1138);
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0db7;
          std::__cxx11::string::~string(local_1158);
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0dc8;
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0ddb;
          std::
          vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  *)&next_in_chunk.
                     super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0dea;
          std::__cxx11::to_string(*(unsigned_long *)(&stack0xffffffffffffe688 + lVar8));
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0e06;
          std::operator+(*(char **)(&stack0xffffffffffffe658 + lVar8),
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (&stack0xffffffffffffe650 + lVar8));
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0e22;
          std::operator+(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (&stack0xffffffffffffe658 + lVar8),
                         *(char **)(&stack0xffffffffffffe650 + lVar8));
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0e3e;
          std::operator+(*(char **)(&stack0xffffffffffffe658 + lVar8),
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (&stack0xffffffffffffe650 + lVar8));
          *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0e53;
          std::runtime_error::runtime_error(prVar7,local_1178);
          *(undefined1 **)(&stack0xffffffffffffe640 + lVar8) = &LAB_003c0e76;
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0fb6;
        std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::clear
                  (*(vector<LinkedReadData,_std::allocator<LinkedReadData>_> **)
                    (&stack0xffffffffffffe640 + lVar8));
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0fc2;
        poVar3 = sdglib::OutputLog(*(LogLevels *)(&stack0xffffffffffffe67c + lVar8),
                                   (bool)(&stack0xffffffffffffe67b)[lVar8]);
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0fde;
        poVar3 = std::operator<<(poVar3,"dumped!");
        *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0ffa;
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::ofstream::~ofstream(&local_f20);
      }
      poVar3 = sdglib::OutputLog((LogLevels)(in_stack_ffffffffffffe678 >> 0x20),
                                 SUB81(in_stack_ffffffffffffe678 >> 0x18,0));
      poVar3 = std::operator<<(poVar3,"performing merge from disk");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(&local_13e0,pcVar6,_S_out);
      bVar1 = std::ios::operator!((ios *)((long)&local_13e0 + *(long *)(local_13e0 + -0x18)));
      if ((bVar1 & 1) == 0) {
        std::ostream::write((char *)&local_13e0,0x567282);
        std::ostream::write((char *)&local_13e0,0x567284);
        local_1404 = 3;
        std::ostream::write((char *)&local_13e0,(long)&local_1404);
        sdglib::write_string
                  ((ofstream *)in_stack_ffffffffffffe660._M_current,
                   (string *)in_stack_ffffffffffffe658._M_current);
        std::ostream::write((char *)&local_13e0,
                            (long)&read_tag.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (in_stack_ffffffffffffe670,in_stack_ffffffffffffe668);
        poVar3 = sdglib::OutputLog((LogLevels)(in_stack_ffffffffffffe678 >> 0x20),
                                   SUB81(in_stack_ffffffffffffe678 >> 0x18,0));
        poVar3 = std::operator<<(poVar3,"leaving space for ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uStack_558);
        poVar3 = std::operator<<(poVar3," read_tag entries");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        sdglib::write_flat_vector<unsigned_int>
                  ((ofstream *)in_stack_ffffffffffffe660._M_current,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   in_stack_ffffffffffffe658._M_current);
        this = &next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
        sVar9 = std::
                vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        *)this);
        local_1408 = (int)sVar9;
        sVar9 = std::
                vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        *)this);
        pLVar20 = (LinkedTag *)(&stack0xffffffffffffe648 + -(sVar9 * 4 + 0xf & 0xfffffffffffffff0));
        psVar21 = (streamoff *)
                  ((long)pLVar20 -
                  ((long)read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage * 2 + 0x11U &
                  0xfffffffffffffff0));
        __range2_1._4_4_ = 0;
        while( true ) {
          psVar21[-1] = 0x3c13bd;
          sVar15 = std::
                   vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                   ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                           *)&next_in_chunk.
                              super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (sVar15 <= (ulong)(long)__range2_1._4_4_) break;
          psVar21[-1] = 0x3c13df;
          pvVar14 = std::
                    vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    ::operator[]((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                  *)&next_in_chunk.
                                     super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)__range2_1._4_4_);
          psVar21[-1] = 0x3c13fe;
          std::istream::read((char *)pvVar14,(long)(pLVar20 + __range2_1._4_4_));
          __range2_1._4_4_ = __range2_1._4_4_ + 1;
        }
        psVar21[-1] = 0x3c141c;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)psVar21[-1]);
        while (local_1408 != 0) {
          __range2_1._0_4_ = 0xffffffff;
          for (__end2_1 = pLVar20; __end2_1 != pLVar20 + sVar9; __end2_1 = __end2_1 + 1) {
            if (*__end2_1 < (LinkedTag)__range2_1) {
              __range2_1._0_4_ = *__end2_1;
            }
          }
          read_to_node.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          while( true ) {
            psVar21[-1] = 0x3c14eb;
            sVar15 = std::
                     vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                     ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                             *)&next_in_chunk.
                                super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
            if (sVar15 <= (ulong)(long)read_to_node.super__Vector_base<long,_std::allocator<long>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)
            break;
            while( true ) {
              psVar21[-1] = 0x3c1513;
              std::
              vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ::operator[]((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            *)&next_in_chunk.
                               super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (long)read_to_node.super__Vector_base<long,_std::allocator<long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
              psVar21[-1] = 0x3c1525;
              bVar1 = std::ios::eof();
              bVar22 = false;
              if ((bVar1 & 1) == 0) {
                bVar22 = pLVar20[read_to_node.super__Vector_base<long,_std::allocator<long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] ==
                         (LinkedTag)__range2_1;
              }
              if (!bVar22) break;
              psVar21[-1] = 0x3c1584;
              pvVar14 = std::
                        vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        ::operator[]((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                      *)&next_in_chunk.
                                         super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (long)read_to_node.
                                           super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                           super__Vector_impl_data._M_end_of_storage._4_4_);
              psVar21[-1] = 0x3c159c;
              std::istream::read((char *)pvVar14,(long)psVar21);
              psVar21[-1] = 0x3c15ba;
              std::ostream::write((char *)&local_13e0,(long)psVar21);
              psVar21[-1] = 0x3c15cc;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)psVar21[3],
                         (value_type_conflict6 *)psVar21[2]);
              psVar21[-1] = 0x3c15e1;
              pvVar14 = std::
                        vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        ::operator[]((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                      *)&next_in_chunk.
                                         super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (long)read_to_node.
                                           super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                           super__Vector_impl_data._M_end_of_storage._4_4_);
              psVar21[-1] = 0x3c1600;
              std::istream::read((char *)pvVar14,
                                 (long)(pLVar20 +
                                       read_to_node.super__Vector_base<long,_std::allocator<long>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
              psVar21[-1] = 0x3c1615;
              std::
              vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ::operator[]((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            *)&next_in_chunk.
                               super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (long)read_to_node.super__Vector_base<long,_std::allocator<long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
              psVar21[-1] = 0x3c1627;
              bVar1 = std::ios::eof();
              if ((bVar1 & 1) != 0) {
                local_1408 = local_1408 + -1;
                pLVar20[read_to_node.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_] = 0xffffffff;
                psVar21[-1] = 0x3c166d;
                poVar3 = sdglib::OutputLog(*(LogLevels *)((long)psVar21 + 0x34),
                                           *(bool *)((long)psVar21 + 0x33));
                psVar21[-1] = 0x3c1689;
                poVar3 = std::operator<<(poVar3,"chunk ");
                psVar21[-1] = 0x3c16a4;
                poVar3 = (ostream *)
                         std::ostream::operator<<
                                   (poVar3,read_to_node.
                                           super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                           super__Vector_impl_data._M_end_of_storage._4_4_);
                psVar21[-1] = 0x3c16c0;
                poVar3 = std::operator<<(poVar3," finished");
                psVar21[-1] = 0x3c16dc;
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              }
            }
            read_to_node.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ =
                 read_to_node.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
          }
        }
        psVar21[-1] = 0x3c1718;
        std::ostream::write((char *)&local_13e0,0x567282);
        psVar21[-1] = 0x3c1732;
        std::ostream::write((char *)&local_13e0,0x567284);
        local_1404 = 6;
        psVar21[-1] = 0x3c1755;
        std::ostream::write((char *)&local_13e0,(long)&local_1404);
        psVar21[-1] = 0x3c176a;
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)psVar21[-1]);
        psVar21[-1] = 0x3c177d;
        sdglib::write_flat_vector<long>
                  ((ofstream *)psVar21[3],(vector<long,_std::allocator<long>_> *)psVar21[2]);
        psVar21[-1] = 0x3c1792;
        std::
        vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
        ::vector((vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
                  *)psVar21[-1]);
        psVar21[-1] = 0x3c17a5;
        sdglib::write_flat_vectorvector<ReadMapping>
                  ((ofstream *)psVar21[5],
                   (vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
                    *)psVar21[4]);
        psVar21[-1] = 0x3c17b3;
        std::__cxx11::string::size();
        psVar21[-1] = 0x3c17c6;
        std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)psVar21[1],*psVar21);
        psVar21[-1] = 0x3c17e2;
        std::ostream::seekp(&local_13e0,__range1,local_1488);
        psVar21[-1] = 0x3c17f0;
        poVar3 = sdglib::OutputLog(*(LogLevels *)((long)psVar21 + 0x34),
                                   *(bool *)((long)psVar21 + 0x33));
        psVar21[-1] = 0x3c180c;
        poVar3 = std::operator<<(poVar3,"writing down ");
        psVar21[-1] = 0x3c1828;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,uStack_558);
        psVar21[-1] = 0x3c1844;
        poVar3 = std::operator<<(poVar3," read_tag entries");
        psVar21[-1] = 0x3c1860;
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        psVar21[-1] = 0x3c1872;
        sdglib::write_flat_vector<unsigned_int>
                  ((ofstream *)psVar21[3],
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)psVar21[2]);
        psVar21[-1] = 0x3c1880;
        std::ofstream::close();
        psVar21[-1] = 0x3c189c;
        __end1 = std::
                 vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                 ::begin((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                          *)*psVar21);
        psVar21[-1] = 0x3c18af;
        c = (basic_ifstream<char,_std::char_traits<char>_> *)
            std::
            vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            ::end((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                   *)*psVar21);
        while( true ) {
          psVar21[-1] = 0x3c18c9;
          bVar22 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>_>
                               *)psVar21[1],
                              (__normal_iterator<std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>_>
                               *)*psVar21);
          if (!bVar22) break;
          psVar21[-1] = 0x3c18db;
          pbStack_14b0 = __gnu_cxx::
                         __normal_iterator<std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>_>
                         ::operator*(&__end1);
          psVar21[-1] = 0x3c18ee;
          std::ifstream::close();
          psVar21[-1] = 0x3c18fe;
          __gnu_cxx::
          __normal_iterator<std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>_>
          ::operator++(&__end1);
        }
        local_14b4 = 0;
        while( true ) {
          uVar16 = (ulong)local_14b4;
          psVar21[-1] = 0x3c1946;
          sVar9 = std::
                  vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                          *)&next_in_chunk.
                             super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (sVar9 <= uVar16) break;
          psVar21[-1] = 0x3c196b;
          std::__cxx11::to_string(*(int *)((long)psVar21 + 0x54));
          psVar21[-1] = 0x3c1987;
          std::operator+((char *)psVar21[2],
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         psVar21[1]);
          psVar21[-1] = 0x3c19a3;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         psVar21[2],(char *)psVar21[1]);
          psVar21[-1] = 0x3c19b1;
          pcVar6 = (char *)std::__cxx11::string::c_str();
          psVar21[-1] = 0x3c19b9;
          unlink(pcVar6);
          psVar21[-1] = 0x3c19c5;
          std::__cxx11::string::~string(local_14d8);
          psVar21[-1] = 0x3c19d1;
          std::__cxx11::string::~string(local_14f8);
          psVar21[-1] = 0x3c19dd;
          std::__cxx11::string::~string(local_1518);
          local_14b4 = local_14b4 + 1;
        }
        psVar21[-1] = 0x3c1a34;
        poVar3 = sdglib::OutputLog(*(LogLevels *)((long)psVar21 + 0x34),
                                   *(bool *)((long)psVar21 + 0x33));
        psVar21[-1] = 0x3c1a50;
        poVar3 = std::operator<<(poVar3,"Datastore with ");
        psVar21[-1] = 0x3c1a62;
        sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
        psVar21[-1] = 0x3c1a74;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar9 * 2);
        psVar21[-1] = 0x3c1a90;
        poVar17 = std::operator<<(poVar3," reads, ");
        psVar21[-1] = 0x3c1aac;
        pLVar18 = (LinkedReadData *)
                  std::ostream::operator<<
                            (poVar17,(ulong)readdatav.
                                            super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        this_00 = pLVar18;
        psVar21[-1] = 0x3c1ac8;
        poVar17 = std::operator<<((ostream *)pLVar18," reads with tags");
        psVar21[-1] = 0x3c1ae4;
        std::ostream::operator<<(poVar17,std::endl<char,std::char_traits<char>>);
        psVar21[-1] = 0x3c1aef;
        gzclose(local_68);
        psVar21[-1] = 0x3c1afd;
        gzclose(local_98);
        psVar21[-1] = 0x3c1b0b;
        std::
        vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
        ::~vector((vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
                   *)psVar21[3]);
        psVar21[-1] = 0x3c1b17;
        std::vector<long,_std::allocator<long>_>::~vector
                  ((vector<long,_std::allocator<long>_> *)psVar21[3]);
        std::ofstream::~ofstream(&local_13e0);
        LinkedReadData::~LinkedReadData(this_00);
        std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::~vector
                  ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)poVar3);
        std::
        vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
        ::~vector((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                   *)poVar3);
        std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::~vector
                  ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)poVar3);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)poVar3);
        return;
      }
      poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
      poVar3 = std::operator<<(poVar3,(string *)output_filename);
      poVar3 = std::operator<<(poVar3,": ");
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      std::operator<<(poVar3,pcVar6);
      local_1401 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffe698,in_stack_ffffffffffffe690);
      std::runtime_error::runtime_error(prVar7,(string *)&openfiles);
      local_1401 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_55c = 0;
    if (format == UCDavis) goto code_r0x003be955;
    if (format != raw) break;
    lVar8 = gzgets(local_68,&r1offset,999);
    if (lVar8 != 0) {
      if ((((char)r1offset != '\0' ^ 0xffU) & 1) == 0x40) {
        local_711 = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(in_stack_ffffffffffffe698,in_stack_ffffffffffffe690);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffe658._M_current,(char *)in_stack_ffffffffffffe650);
        std::runtime_error::runtime_error(prVar7,local_6f0);
        local_711 = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar8 = gzgets(local_68,&r1offset,999);
      if (lVar8 != 0) {
        for (local_718 = 0; local_718 < 0x10; local_718 = local_718 + 1) {
          local_55c = local_55c * 4;
          if (readbuffer[(long)local_718 + -8] == 'C') {
            local_55c = local_55c + 1;
          }
          else if (readbuffer[(long)local_718 + -8] == 'G') {
            local_55c = local_55c + 2;
          }
          else if (readbuffer[(long)local_718 + -8] == 'T') {
            local_55c = local_55c + 3;
          }
          else if (readbuffer[(long)local_718 + -8] != 'A') {
            local_55c = 0;
            break;
          }
        }
        pairs._0_4_ = local_55c;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_738,readbuffer + 0xf,&local_739);
        std::__cxx11::string::operator=((string *)&currrent_read,local_738);
        std::__cxx11::string::~string(local_738);
        std::allocator<char>::~allocator((allocator<char> *)&local_739);
        pcVar6 = (char *)std::__cxx11::string::back();
        if (*pcVar6 == '\n') {
          std::__cxx11::string::size();
          std::__cxx11::string::resize((ulong)&currrent_read);
        }
        lVar8 = gzgets(local_68,&r1offset,999);
        if (lVar8 != 0) {
          if ((((char)r1offset != '\0' ^ 0xffU) & 1) == 0x2b) {
            local_781 = 1;
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(in_stack_ffffffffffffe698,in_stack_ffffffffffffe690);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe658._M_current,(char *)in_stack_ffffffffffffe650);
            std::runtime_error::runtime_error(prVar7,local_760);
            local_781 = 0;
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          lVar8 = gzgets(local_68,&r1offset,999);
          if ((lVar8 != 0) && (lVar8 = gzgets(local_98,&r1offset,999), lVar8 != 0)) {
            if ((((char)r1offset != '\0' ^ 0xffU) & 1) == 0x40) {
              local_7c9 = 1;
              prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(in_stack_ffffffffffffe698,in_stack_ffffffffffffe690);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffe658._M_current,(char *)in_stack_ffffffffffffe650)
              ;
              std::runtime_error::runtime_error(prVar7,local_7a8);
              local_7c9 = 0;
              __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            lVar8 = gzgets(local_98,&r1offset,999);
            if (lVar8 != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_7f0,(char *)&r1offset,&local_7f1);
              std::__cxx11::string::operator=
                        ((string *)(currrent_read.seq1.field_2._M_local_buf + 8),local_7f0);
              std::__cxx11::string::~string(local_7f0);
              std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
              pcVar6 = (char *)std::__cxx11::string::back();
              if (*pcVar6 == '\n') {
                std::__cxx11::string::size();
                std::__cxx11::string::resize((ulong)((long)&currrent_read.seq1.field_2 + 8));
              }
              lVar8 = gzgets(local_98,&r1offset,999);
              if (lVar8 != 0) {
                if ((((char)r1offset != '\0' ^ 0xffU) & 1) == 0x2b) {
                  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::operator+(in_stack_ffffffffffffe698,in_stack_ffffffffffffe690);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffe658._M_current,
                                 (char *)in_stack_ffffffffffffe650);
                  std::runtime_error::runtime_error(prVar7,local_818);
                  __cxa_throw(prVar7,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                lVar8 = gzgets(local_98,&r1offset,999);
                goto joined_r0x003bf967;
              }
            }
          }
        }
      }
    }
  }
  goto LAB_003bf972;
code_r0x003be955:
  lVar8 = gzgets(local_68,&r1offset,999);
  if (lVar8 != 0) {
    if ((((char)r1offset != '\0' ^ 0xffU) & 1) == 0x40) {
      local_5a1 = 1;
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffe698,in_stack_ffffffffffffe690);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe658._M_current,(char *)in_stack_ffffffffffffe650);
      std::runtime_error::runtime_error(prVar7,local_580);
      local_5a1 = 0;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (local_5a8 = 1; local_5a8 < 0x11; local_5a8 = local_5a8 + 1) {
      local_55c = local_55c * 4;
      if (readbuffer[(long)local_5a8 + -8] == 'C') {
        local_55c = local_55c + 1;
      }
      else if (readbuffer[(long)local_5a8 + -8] == 'G') {
        local_55c = local_55c + 2;
      }
      else if (readbuffer[(long)local_5a8 + -8] == 'T') {
        local_55c = local_55c + 3;
      }
      else if (readbuffer[(long)local_5a8 + -8] != 'A') {
        local_55c = 0;
        break;
      }
    }
    pairs._0_4_ = local_55c;
    lVar8 = gzgets(local_68,&r1offset,999);
    if (lVar8 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5c8,(char *)&r1offset,&local_5c9);
      std::__cxx11::string::operator=((string *)&currrent_read,local_5c8);
      std::__cxx11::string::~string(local_5c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
      pcVar6 = (char *)std::__cxx11::string::back();
      if (*pcVar6 == '\n') {
        std::__cxx11::string::size();
        std::__cxx11::string::resize((ulong)&currrent_read);
      }
      lVar8 = gzgets(local_68,&r1offset,999);
      if (lVar8 != 0) {
        if ((((char)r1offset != '\0' ^ 0xffU) & 1) == 0x2b) {
          local_611 = 1;
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(in_stack_ffffffffffffe698,in_stack_ffffffffffffe690);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffe658._M_current,(char *)in_stack_ffffffffffffe650);
          std::runtime_error::runtime_error(prVar7,local_5f0);
          local_611 = 0;
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar8 = gzgets(local_68,&r1offset,999);
        if ((lVar8 != 0) && (lVar8 = gzgets(local_98,&r1offset,999), lVar8 != 0)) {
          if ((((char)r1offset != '\0' ^ 0xffU) & 1) == 0x40) {
            local_659 = 1;
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(in_stack_ffffffffffffe698,in_stack_ffffffffffffe690);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_ffffffffffffe658._M_current,(char *)in_stack_ffffffffffffe650);
            std::runtime_error::runtime_error(prVar7,local_638);
            local_659 = 0;
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          lVar8 = gzgets(local_98,&r1offset,999);
          if (lVar8 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_680,(char *)&r1offset,&local_681);
            std::__cxx11::string::operator=
                      ((string *)(currrent_read.seq1.field_2._M_local_buf + 8),local_680);
            std::__cxx11::string::~string(local_680);
            std::allocator<char>::~allocator((allocator<char> *)&local_681);
            pcVar6 = (char *)std::__cxx11::string::back();
            if (*pcVar6 == '\n') {
              std::__cxx11::string::size();
              std::__cxx11::string::resize((ulong)((long)&currrent_read.seq1.field_2 + 8));
            }
            lVar8 = gzgets(local_98,&r1offset,999);
            if (lVar8 != 0) {
              if ((((char)r1offset != '\0' ^ 0xffU) & 1) == 0x2b) {
                local_6c9 = 1;
                prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+(in_stack_ffffffffffffe698,in_stack_ffffffffffffe690);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffe658._M_current,
                               (char *)in_stack_ffffffffffffe650);
                std::runtime_error::runtime_error(prVar7,local_6a8);
                local_6c9 = 0;
                __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              lVar8 = gzgets(local_98,&r1offset,999);
joined_r0x003bf967:
              if (lVar8 != 0) {
LAB_003bf972:
                if (local_55c != 0) {
                  readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)((long)&(readdatav.
                                         super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->tag +
                                2);
                }
                uStack_558 = uStack_558 + 1;
                std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::push_back
                          ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)
                           in_stack_ffffffffffffe660._M_current,in_stack_ffffffffffffe658._M_current
                          );
                sVar9 = std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::size
                                  ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)
                                   &chunkfiles.
                                    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                if (sVar9 == chunksize) {
                  std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::begin
                            (in_stack_ffffffffffffe648);
                  std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::end
                            (in_stack_ffffffffffffe648);
                  std::
                  sort<__gnu_cxx::__normal_iterator<LinkedReadData*,std::vector<LinkedReadData,std::allocator<LinkedReadData>>>>
                            (in_stack_ffffffffffffe660,in_stack_ffffffffffffe658);
                  std::
                  vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                          *)&next_in_chunk.
                             super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::__cxx11::to_string(in_stack_ffffffffffffe688);
                  std::operator+((char *)in_stack_ffffffffffffe658._M_current,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffe650);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffe658._M_current,
                                 (char *)in_stack_ffffffffffffe650);
                  std::ofstream::ofstream(&local_a50,local_a70,_S_out);
                  std::__cxx11::string::~string(local_a70);
                  std::__cxx11::string::~string(local_a90);
                  std::__cxx11::string::~string(local_ab0);
                  poVar3 = sdglib::OutputLog((LogLevels)(in_stack_ffffffffffffe678 >> 0x20),
                                             SUB81(in_stack_ffffffffffffe678 >> 0x18,0));
                  sVar9 = std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::size
                                    ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)
                                     &chunkfiles.
                                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar9);
                  poVar3 = std::operator<<(poVar3," pairs dumping on chunk ");
                  sVar9 = std::
                          vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                          ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                  *)&next_in_chunk.
                                     super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  pvVar10 = (void *)std::ostream::operator<<(poVar3,sVar9);
                  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
                  bVar1 = std::ios::operator!((ios *)((long)&local_a50 +
                                                     *(long *)(local_a50 + -0x18)));
                  if ((bVar1 & 1) != 0) {
                    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
                    std::
                    vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            *)&next_in_chunk.
                               super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
                    std::__cxx11::to_string(in_stack_ffffffffffffe688);
                    std::operator+((char *)in_stack_ffffffffffffe658._M_current,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffe650);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffe658._M_current,
                                   (char *)in_stack_ffffffffffffe650);
                    poVar3 = std::operator<<(poVar3,local_ad0);
                    poVar3 = std::operator<<(poVar3,": ");
                    piVar5 = __errno_location();
                    pcVar6 = strerror(*piVar5);
                    std::operator<<(poVar3,pcVar6);
                    std::__cxx11::string::~string(local_ad0);
                    std::__cxx11::string::~string(local_af0);
                    std::__cxx11::string::~string(local_b10);
                    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::
                    vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            *)&next_in_chunk.
                               super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
                    std::__cxx11::to_string(in_stack_ffffffffffffe688);
                    std::operator+((char *)in_stack_ffffffffffffe658._M_current,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffe650);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffe658._M_current,
                                   (char *)in_stack_ffffffffffffe650);
                    std::operator+((char *)in_stack_ffffffffffffe658._M_current,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_ffffffffffffe650);
                    std::runtime_error::runtime_error(prVar7,local_b30);
                    __cxa_throw(prVar7,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  poVar3 = sdglib::OutputLog((LogLevels)(in_stack_ffffffffffffe678 >> 0x20),
                                             SUB81(in_stack_ffffffffffffe678 >> 0x18,0));
                  sVar9 = std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::size
                                    ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)
                                     &chunkfiles.
                                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar9);
                  poVar3 = std::operator<<(poVar3," pairs dumping on chunk ");
                  sVar9 = std::
                          vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                          ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                  *)&next_in_chunk.
                                     super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  pvVar10 = (void *)std::ostream::operator<<(poVar3,sVar9);
                  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
                  lVar8 = -((long)read_tag.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage * 2 + 0x11U &
                           0xfffffffffffffff0);
                  puVar19 = (undefined8 *)(&stack0xffffffffffffe648 + lVar8);
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3bff28;
                  __end3 = std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::begin
                                     ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)
                                      *puVar19);
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3bff3b;
                  r = (LinkedReadData *)
                      std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::end
                                ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)*puVar19
                                );
                  while( true ) {
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3bff55;
                    bVar22 = __gnu_cxx::operator!=
                                       (*(__normal_iterator<LinkedReadData_*,_std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>_>
                                          **)(&stack0xffffffffffffe650 + lVar8),
                                        (__normal_iterator<LinkedReadData_*,_std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>_>
                                         *)*puVar19);
                    if (!bVar22) break;
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3bff6a;
                    pLVar11 = __gnu_cxx::
                              __normal_iterator<LinkedReadData_*,_std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>_>
                              ::operator*(&__end3);
                    local_bc8 = pLVar11;
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3bff89;
                    std::ostream::write((char *)&local_a50,(long)pLVar11);
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3bffa4;
                    memset(puVar19,0,
                           (long)read_tag.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage * 2 + 2);
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3bffb4;
                    pvVar10 = (void *)std::__cxx11::string::data();
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3bffcb;
                    puVar12 = (pointer)std::__cxx11::string::size();
                    if (read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage < puVar12) {
                      local_1778 = read_tag.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage;
                    }
                    else {
                      *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3bffee;
                      local_1778 = (pointer)std::__cxx11::string::size();
                    }
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c000f;
                    memcpy(puVar19,pvVar10,(size_t)local_1778);
                    lVar13 = (long)puVar19 +
                             (long)read_tag.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage;
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0035;
                    pvVar10 = (void *)std::__cxx11::string::data();
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c004c;
                    puVar12 = (pointer)std::__cxx11::string::size();
                    if (read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage < puVar12) {
                      local_1790 = read_tag.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage;
                    }
                    else {
                      *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c006f;
                      local_1790 = (pointer)std::__cxx11::string::size();
                    }
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0090;
                    memcpy((void *)(lVar13 + 1),pvVar10,(size_t)local_1790);
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c00ac;
                    std::ostream::write((char *)&local_a50,(long)puVar19);
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c00bc;
                    __gnu_cxx::
                    __normal_iterator<LinkedReadData_*,_std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>_>
                    ::operator++(&__end3);
                  }
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c00cd;
                  std::ofstream::close();
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c00db;
                  std::
                  vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                          *)&next_in_chunk.
                             super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c00ea;
                  std::__cxx11::to_string(*(unsigned_long *)(&stack0xffffffffffffe688 + lVar8));
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0106;
                  std::operator+(*(char **)(&stack0xffffffffffffe658 + lVar8),
                                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   **)(&stack0xffffffffffffe650 + lVar8));
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0122;
                  std::operator+(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   **)(&stack0xffffffffffffe658 + lVar8),
                                 *(char **)(&stack0xffffffffffffe650 + lVar8));
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0137;
                  std::vector<std::ifstream,std::allocator<std::ifstream>>::
                  emplace_back<std::__cxx11::string>
                            (*(vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                               **)(&stack0xffffffffffffe660 + lVar8),
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              (&stack0xffffffffffffe658 + lVar8));
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0145;
                  std::__cxx11::string::~string(local_be8);
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0151;
                  std::__cxx11::string::~string(local_c08);
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c015d;
                  std::__cxx11::string::~string(local_c28);
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0169;
                  pvVar14 = std::
                            vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            ::back(*(vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                     **)(&stack0xffffffffffffe650 + lVar8));
                  lVar13 = *(long *)(*(long *)pvVar14 + -0x18);
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c017b;
                  bVar1 = std::ios::operator!((ios *)(pvVar14 + lVar13));
                  if ((bVar1 & 1) != 0) {
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c01a5;
                    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c01ba;
                    std::
                    vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            *)&next_in_chunk.
                               super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c01c9;
                    std::__cxx11::to_string(*(unsigned_long *)(&stack0xffffffffffffe688 + lVar8));
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c01e5;
                    std::operator+(*(char **)(&stack0xffffffffffffe658 + lVar8),
                                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     **)(&stack0xffffffffffffe650 + lVar8));
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0201;
                    std::operator+(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     **)(&stack0xffffffffffffe658 + lVar8),
                                   *(char **)(&stack0xffffffffffffe650 + lVar8));
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0216;
                    poVar3 = std::operator<<(poVar3,local_c48);
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0232;
                    poVar3 = std::operator<<(poVar3,": ");
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0240;
                    piVar5 = __errno_location();
                    iVar2 = *piVar5;
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0247;
                    pcVar6 = strerror(iVar2);
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0256;
                    std::operator<<(poVar3,pcVar6);
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0264;
                    std::__cxx11::string::~string(local_c48);
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0270;
                    std::__cxx11::string::~string(local_c68);
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c027c;
                    std::__cxx11::string::~string(local_c88);
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c028d;
                    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c02a0;
                    std::
                    vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    ::size((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            *)&next_in_chunk.
                               super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c02af;
                    std::__cxx11::to_string(*(unsigned_long *)(&stack0xffffffffffffe688 + lVar8));
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c02cb;
                    std::operator+(*(char **)(&stack0xffffffffffffe658 + lVar8),
                                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     **)(&stack0xffffffffffffe650 + lVar8));
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c02e7;
                    std::operator+(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     **)(&stack0xffffffffffffe658 + lVar8),
                                   *(char **)(&stack0xffffffffffffe650 + lVar8));
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0303;
                    std::operator+(*(char **)(&stack0xffffffffffffe658 + lVar8),
                                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     **)(&stack0xffffffffffffe650 + lVar8));
                    *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0318;
                    std::runtime_error::runtime_error(prVar7,local_ca8);
                    *(undefined1 **)(&stack0xffffffffffffe640 + lVar8) = &LAB_003c033b;
                    __cxa_throw(prVar7,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c047b;
                  std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::clear
                            (*(vector<LinkedReadData,_std::allocator<LinkedReadData>_> **)
                              (&stack0xffffffffffffe640 + lVar8));
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c0487;
                  poVar3 = sdglib::OutputLog(*(LogLevels *)(&stack0xffffffffffffe67c + lVar8),
                                             (bool)(&stack0xffffffffffffe67b)[lVar8]);
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c04a3;
                  poVar3 = std::operator<<(poVar3,"dumped!");
                  *(undefined8 *)(&stack0xffffffffffffe640 + lVar8) = 0x3c04bf;
                  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                  std::ofstream::~ofstream(&local_a50);
                }
              }
            }
          }
        }
      }
    }
  }
  goto LAB_003be8e6;
}

Assistant:

void LinkedReadsDatastore::build_from_fastq(std::string output_filename, std::string default_name, std::string read1_filename,
                                            std::string read2_filename,
                                            LinkedReadsFormat format, uint64_t readsize, size_t chunksize) {
    std::vector<uint32_t> read_tag;
    //std::cout<<"Memory used by every read's entry:"<< sizeof(LinkedRead)<<std::endl;
    //read each read, put it on the index and on the appropriate tag
    sdglib::OutputLog(sdglib::LogLevels::INFO)<<"Creating Datastore Index from "<<read1_filename<<" | "<<read2_filename<<std::endl;
    auto fd1=gzopen(read1_filename.c_str(),"r");
    if (!fd1) {
        std::cerr << "Failed to open " << read1_filename <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + read1_filename);
    }
    auto fd2=gzopen(read2_filename.c_str(),"r");

    if (!fd2) {
        std::cerr << "Failed to open " << read2_filename <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + read2_filename);
    }
    char readbuffer[1000];
    uint64_t r1offset,r2offset;
    uint64_t tagged_reads=0;
    //first, build an index of tags and offsets
    sdglib::OutputLog()<<"Building tag sorted chunks of "<<chunksize<<" pairs"<<std::endl;
    std::vector<LinkedReadData> readdatav;
    readdatav.reserve(chunksize);
    std::vector<std::ifstream> chunkfiles;
    std::vector<LinkedReadData> next_in_chunk;
    LinkedReadData currrent_read;
    //First, create the chunk files
    uint64_t pairs=0;
    while (!gzeof(fd1) and !gzeof(fd2)) {
        LinkedTag newtag = 0;
        if (format==LinkedReadsFormat::UCDavis) {
            //LinkedRead r1,r2;
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            if(!readbuffer[0] == '@') {
                throw std::runtime_error("Please check: " + read1_filename + ", it seems to be missing a header");
            }
            //Tag to number from r1's name
            for (auto i = 1; i < 17; ++i) {
                newtag <<= 2;
                if (readbuffer[i] == 'C') newtag += 1;
                else if (readbuffer[i] == 'G') newtag += 2;
                else if (readbuffer[i] == 'T') newtag += 3;
                else if (readbuffer[i] != 'A') {
                    newtag = 0;
                    break;
                }
            }
            currrent_read.tag=newtag;
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            currrent_read.seq1=std::string(readbuffer);
            if (currrent_read.seq1.back()=='\n') currrent_read.seq1.resize(currrent_read.seq1.size()-1);
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            if(!readbuffer[0] == '+') {
                throw std::runtime_error("Please check: " + read1_filename + ", it seems to be desynchronised a header");
            }
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;

            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            if(!readbuffer[0] == '@') {
                throw std::runtime_error("Please check: " + read2_filename + ", it seems to be missing a header");
            }
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            currrent_read.seq2=std::string(readbuffer);
            if (currrent_read.seq2.back()=='\n') currrent_read.seq2.resize(currrent_read.seq2.size()-1);
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            if(!readbuffer[0] == '+') {
                throw std::runtime_error("Please check: " + read2_filename + ", it seems to be desynchronised a header");
            }
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
        }
        else if (format==LinkedReadsFormat::raw){
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            if(!readbuffer[0] == '@') {
                throw std::runtime_error("Please check: " + read1_filename + ", it seems to be missing a header");
            }
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            for (auto i = 0; i < 16; ++i) {
                newtag <<= 2;
                if (readbuffer[i] == 'C') newtag += 1;
                else if (readbuffer[i] == 'G') newtag += 2;
                else if (readbuffer[i] == 'T') newtag += 3;
                else if (readbuffer[i] != 'A') {
                    newtag = 0;
                    break;
                }
            }
            currrent_read.tag=newtag;
            currrent_read.seq1=std::string(readbuffer + 16 + 7);
            if (currrent_read.seq1.back()=='\n') currrent_read.seq1.resize(currrent_read.seq1.size()-1);
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            if(!readbuffer[0] == '+') {
                throw std::runtime_error("Please check: " + read1_filename + ", it seems to be desynchronised a header");
            }
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;

            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            if(!readbuffer[0] == '@') {
                throw std::runtime_error("Please check: " + read2_filename + ", it seems to be missing a header");
            }
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            currrent_read.seq2=std::string(readbuffer);
            if (currrent_read.seq2.back()=='\n') currrent_read.seq2.resize(currrent_read.seq2.size()-1);
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            if(!readbuffer[0] == '+') {
                throw std::runtime_error("Please check: " + read2_filename + ", it seems to be desynchronised a header");
            }
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
        }
        if (0 != newtag) tagged_reads += 2;
        ++pairs;
        readdatav.push_back(currrent_read);
        if (readdatav.size()==chunksize){
            //sort
            std::sort(readdatav.begin(),readdatav.end());
            //dump
            std::ofstream ofile("sorted_chunk_"+std::to_string(chunkfiles.size())+".data");
            sdglib::OutputLog()<<readdatav.size()<<" pairs dumping on chunk "<<chunkfiles.size()<<std::endl;
            if (!ofile) {
                std::cerr << "Failed to open " << ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") <<": " << strerror(errno);
                throw std::runtime_error("Could not open " + ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") );

            }

            sdglib::OutputLog()<<readdatav.size()<<" pairs dumping on chunk "<<chunkfiles.size()<<std::endl;
            //add file to vector of files
            char buffer[2*readsize+2];
            for (auto &r:readdatav){
                ofile.write((const char * ) &r.tag,sizeof(r.tag));
                bzero(buffer,2*readsize+2);
                memcpy(buffer,r.seq1.data(),(r.seq1.size()>readsize ? readsize : r.seq1.size()));
                memcpy(buffer+readsize+1,r.seq2.data(),(r.seq2.size()>readsize ? readsize : r.seq2.size()));
                ofile.write(buffer,2*readsize+2);
            }
            ofile.close();
            chunkfiles.emplace_back("sorted_chunk_"+std::to_string(chunkfiles.size())+".data");
            if (!chunkfiles.back()) {
                std::cerr << "Failed to open " << ("sorted_chunk_"+std::to_string(chunkfiles.size())+".data") <<": " << strerror(errno);
                throw std::runtime_error("Could not open " + ("sorted_chunk_"+std::to_string(chunkfiles.size())+".data") );
            }
            readdatav.clear();
            sdglib::OutputLog()<<"dumped!"<<std::endl;
        }
    }
    if (readdatav.size()>0) {
        //sort
        std::sort(readdatav.begin(), readdatav.end());
        //dump
        std::ofstream ofile("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data");
        sdglib::OutputLog() << readdatav.size() << " pairs dumping on chunk " << chunkfiles.size() << std::endl;
        if (!ofile) {
            std::cerr << "Failed to open " << ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") <<": " << strerror(errno);
            throw std::runtime_error("Could not open " + ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") );

        }
        sdglib::OutputLog() << readdatav.size() << " pairs dumping on chunk " << chunkfiles.size() << std::endl;
        //add file to vector of files
        char buffer[2 * readsize + 2];
        for (auto &r:readdatav) {
            ofile.write((const char *) &r.tag, sizeof(r.tag));
            bzero(buffer, 2 * readsize + 2);
            memcpy(buffer, r.seq1.data(), (r.seq1.size() > readsize ? readsize : r.seq1.size()));
            memcpy(buffer + readsize + 1, r.seq2.data(), (r.seq2.size() > readsize ? readsize : r.seq2.size()));
            ofile.write(buffer, 2 * readsize + 2);
        }
        ofile.close();
        chunkfiles.emplace_back("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data");
        if (!chunkfiles.back()) {
            std::cerr << "Failed to open " << ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") <<": " << strerror(errno);
            throw std::runtime_error("Could not open " + ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data"));
        }
        readdatav.clear();
        sdglib::OutputLog() << "dumped!" << std::endl;
    }
    sdglib::OutputLog() << "performing merge from disk" << std::endl;
    //TODO: save space first for the tag index!!!
    std::ofstream output(output_filename.c_str());
    if (!output) {
        std::cerr << "Failed to open " << output_filename <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + output_filename);
    }

    output.write((const char *) &SDG_MAGIC, sizeof(SDG_MAGIC));
    output.write((const char *) &SDG_VN, sizeof(SDG_VN));
    SDG_FILETYPE type(LinkedDS_FT);
    output.write((char *) &type, sizeof(type));

    sdglib::write_string(output, default_name);

    output.write((const char *) &readsize,sizeof(readsize));
    read_tag.resize(pairs);
    sdglib::OutputLog() << "leaving space for " <<pairs<<" read_tag entries"<< std::endl;

    sdglib::write_flat_vector(output,read_tag);

    //multi_way merge of the chunks
    int openfiles=chunkfiles.size();
    LinkedTag next_tags[chunkfiles.size()];
    char buffer[2 * readsize + 2];
    //read a bit from each file
    for (auto i=0;i<chunkfiles.size();++i) chunkfiles[i].read((char *)&next_tags[i],sizeof(LinkedTag));
    read_tag.clear();
    while(openfiles){
        LinkedTag mintag=UINT32_MAX;
        //find the minimum tag
        for (auto &t:next_tags) if (t<mintag) mintag=t;
        //copy from each file till the next tag is > than minimum
        for (auto i=0;i<chunkfiles.size();++i){
            while (!chunkfiles[i].eof() and next_tags[i]==mintag){
                //read buffer from file and write to final file
                chunkfiles[i].read(buffer,2*readsize+2);
                output.write(buffer,2*readsize+2);
                read_tag.push_back(mintag);
                //read next tag... eof? tag=UINT32_MAX
                chunkfiles[i].read((char *)&next_tags[i],sizeof(LinkedTag));
                if (chunkfiles[i].eof()) {
                    --openfiles;
                    next_tags[i]=UINT32_MAX;
                    sdglib::OutputLog() << "chunk "<<i<<" finished"<<std::endl;
                }
            }
        }
    }

    // Write empty mapper data
    output.write((char *) &SDG_MAGIC, sizeof(SDG_MAGIC));
    output.write((char *) &SDG_VN, sizeof(SDG_VN));
    type = PairedMap_FT;
    output.write((char *) &type, sizeof(type));

    std::vector<sgNodeID_t> read_to_node;
    sdglib::write_flat_vector(output, read_to_node);
    std::vector<std::vector<ReadMapping>> reads_in_node;
    sdglib::write_flat_vectorvector(output, reads_in_node);

    // Done

    //go back to the beginning of the file and write the read_tag part again
    output.seekp(sizeof(SDG_MAGIC)+sizeof(SDG_VN)+sizeof(type)+sizeof(readsize)+sizeof(uint64_t)+(default_name.size()*sizeof(char)));
    sdglib::OutputLog() << "writing down " <<pairs<<" read_tag entries"<< std::endl;
    sdglib::write_flat_vector(output, read_tag);

    output.close();
    //delete all temporary chunk files
    for (auto &c:chunkfiles) c.close();
    for (auto i=0;i<chunkfiles.size();++i) ::unlink(("sorted_chunk_"+std::to_string(i)+".data").c_str());
    //DONE!
    sdglib::OutputLog(sdglib::LogLevels::INFO)<<"Datastore with "<<(read_tag.size())*2<<" reads, "<<tagged_reads<<" reads with tags"<<std::endl; //and "<<reads_in_tag.size()<<"tags"<<std::endl;
    gzclose(fd1);
    gzclose(fd2);
}